

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O0

void __thiscall
asmjit::v1_14::BaseEmitter::setErrorHandler(BaseEmitter *this,ErrorHandler *errorHandler)

{
  ErrorHandler *errorHandler_local;
  BaseEmitter *this_local;
  
  if (errorHandler == (ErrorHandler *)0x0) {
    this->_errorHandler = (ErrorHandler *)0x0;
    this->_emitterFlags = this->_emitterFlags & this->_emitterFlags & ~kOwnErrorHandler;
    if (this->_code != (CodeHolder *)0x0) {
      this->_errorHandler = this->_code->_errorHandler;
    }
  }
  else {
    this->_errorHandler = errorHandler;
    this->_emitterFlags = this->_emitterFlags | kOwnErrorHandler;
  }
  return;
}

Assistant:

void BaseEmitter::setErrorHandler(ErrorHandler* errorHandler) noexcept {
  if (errorHandler) {
    _errorHandler = errorHandler;
    _addEmitterFlags(EmitterFlags::kOwnErrorHandler);
  }
  else {
    _errorHandler = nullptr;
    _clearEmitterFlags(EmitterFlags::kOwnErrorHandler);
    if (_code)
      _errorHandler = _code->errorHandler();
  }
}